

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O0

parser_error parse_ghost_spell_power(parser *p)

{
  uint uVar1;
  void *pvVar2;
  long *local_20;
  ghost_level *l;
  ghost *g;
  parser *p_local;
  
  pvVar2 = parser_priv(p);
  if (pvVar2 != (void *)0x0) {
    for (local_20 = *(long **)((long)pvVar2 + 0x18); *local_20 != 0; local_20 = (long *)*local_20) {
    }
    uVar1 = parser_getuint(p,"mult");
    *(uint *)((long)local_20 + 0xc) = uVar1;
    uVar1 = parser_getuint(p,"div");
    *(uint *)(local_20 + 2) = uVar1;
    return PARSE_ERROR_NONE;
  }
  __assert_fail("g",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-init.c"
                ,0x7bb,"enum parser_error parse_ghost_spell_power(struct parser *)");
}

Assistant:

static enum parser_error parse_ghost_spell_power(struct parser *p) {
	struct ghost *g = parser_priv(p);
	struct ghost_level *l;
	assert(g);
	l = g->level;
	while (l->next) {
		l = l->next;
	}

	l->spell_power.param1 = parser_getuint(p, "mult");
	l->spell_power.param2 = parser_getuint(p, "div");
	return PARSE_ERROR_NONE;
}